

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::ClearTest::TestClearDepthAndStencil
          (ClearTest *this,GLfloat depth,GLint stencil)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  float fVar4;
  float fVar5;
  GLint the_stencil;
  GLfloat the_depth;
  int local_1c4;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x1e8))(depth,this->m_fbo,0x84f9,0,stencil);
  iVar1 = (**(code **)(lVar3 + 0x800))();
  if (iVar1 == 0) {
    local_1c0.m_getName = (GetNameFunc)((ulong)local_1c0.m_getName._4_4_ << 0x20);
    local_1c4 = 0;
    (**(code **)(lVar3 + 0x1220))(0,0,1,1,0x1902,0x1406,&local_1c0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glReadPixel has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x95d);
    (**(code **)(lVar3 + 0x1220))(0,0,1,1,0x1901,0x1404,&local_1c4);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glReadPixel has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x960);
    fVar4 = local_1c0.m_getName._0_4_ - depth;
    fVar5 = -fVar4;
    if (-fVar4 <= fVar4) {
      fVar5 = fVar4;
    }
    if ((fVar5 < 0.015625) || (local_1c4 == stencil)) goto LAB_00aa7302;
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),
               "ClearNamedFramebufferfi did not cleared depth/stencil attachment of the framebuffer."
               ,0x54);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"ClearNamedFramebufferufi unexpectedly generated ",0x30);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar1;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," error. Test fails.",0x13);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
LAB_00aa7302:
  return iVar1 == 0;
}

Assistant:

bool ClearTest::TestClearDepthAndStencil(glw::GLfloat depth, glw::GLint stencil)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Clearing depth and stencil. */
	gl.clearNamedFramebufferfi(m_fbo, GL_DEPTH_STENCIL, 0, depth, stencil);

	if (glw::GLenum error = gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "ClearNamedFramebufferufi unexpectedly generated " << glu::getErrorStr(error)
			<< " error. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	/* Clear. */
	/* Fetching framebuffer content. */
	glw::GLfloat the_depth   = 0.f;
	glw::GLint   the_stencil = 0;

	gl.readPixels(0, 0, 1, 1, GL_DEPTH_COMPONENT, GL_FLOAT, &the_depth);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixel has failed");

	gl.readPixels(0, 0, 1, 1, GL_STENCIL_INDEX, GL_INT, &the_stencil);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixel has failed");

	/* Comparison with reference value. */
	if (Compare(the_depth, depth) || Compare(the_stencil, stencil))
	{
		return true;
	}

	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "ClearNamedFramebufferfi did not cleared depth/stencil attachment of the framebuffer."
		<< tcu::TestLog::EndMessage;

	return true;
}